

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::IsFrozen
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance)

{
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  int iVar1;
  DictionaryPropertyDescriptor<int> *this_01;
  ArrayObject *pAVar2;
  int index;
  int iVar3;
  
  if (((this->super_DynamicTypeHandler).flags & 1) == 0) {
    for (iVar3 = 0; this_00 = (this->propertyMap).ptr, iVar3 < this_00->count - this_00->freeCount;
        iVar3 = iVar3 + 1) {
      this_01 = JsUtil::
                BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetReferenceAt(this_00,iVar3);
      if ((this_01->Attributes & 0x18) == 0) {
        if ((this_01->Attributes & 2) != 0) {
          return 0;
        }
        iVar1 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>(this_01);
        if ((iVar1 != -1) && ((this_01->Attributes & 4) != 0)) {
          return 0;
        }
      }
    }
    pAVar2 = DynamicObject::GetObjectArray(instance);
    if ((pAVar2 == (ArrayObject *)0x0) ||
       (iVar3 = (*(pAVar2->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6e])(pAVar2),
       iVar3 != 0)) {
      return 1;
    }
  }
  return 0;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::IsFrozen(DynamicObject* instance)
    {
        if (this->GetFlags() & IsExtensibleFlag)
        {
            return false;
        }

        DictionaryPropertyDescriptor<T> *descriptor = nullptr;
        for (T index = 0; index < propertyMap->Count(); index++)
        {
            descriptor = propertyMap->GetReferenceAt(index);
            if ((!(descriptor->Attributes & PropertyDeleted) && !(descriptor->Attributes & PropertyLetConstGlobal)))
            {
                if (descriptor->Attributes & PropertyConfigurable)
                {
                    return false;
                }

                if (descriptor->template GetDataPropertyIndex<false>() != NoSlots && (descriptor->Attributes & PropertyWritable))
                {
                    // Only data descriptor has [[Writable]] property
                    return false;
                }
            }
        }

        // Use IsObjectArrayFrozen() to skip "length" [[Writable]] check
        ArrayObject * objectArray = instance->GetObjectArray();
        if (objectArray && !objectArray->IsObjectArrayFrozen())
        {
            return false;
        }

        return true;
    }